

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O3

TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> __thiscall
TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::PopItem
          (TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
           *this)

{
  _List_node_base *p_Var1;
  int iVar2;
  undefined8 *puVar3;
  TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> extraout_RDX;
  long in_RSI;
  list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
  *this_00;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> TVar4;
  
  *(undefined4 *)&this->fInput = 0xffffffff;
  puVar3 = (undefined8 *)operator_new(0x10);
  *(undefined4 *)(puVar3 + 1) = 0;
  *puVar3 = 0;
  LOCK();
  *(undefined4 *)(puVar3 + 1) = 1;
  UNLOCK();
  *(undefined8 **)(this->fAlpha)._M_value = puVar3;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x18));
  if (iVar2 == 0) {
    if (*(long *)(in_RSI + 0x58) != 0) {
      this_00 = (list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                 *)(in_RSI + 0x48);
      p_Var1 = (this_00->
               super__List_base<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      *(undefined4 *)&this->fInput = *(undefined4 *)&p_Var1[1]._M_next;
      TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>::operator=
                ((TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> *)&this->fAlpha,
                 (TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> *)&p_Var1[1]._M_prev);
      std::__cxx11::
      list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
      ::_M_erase(this_00,(this_00->
                         super__List_base<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x18));
    TVar4.fSub.fRef = extraout_RDX.fRef;
    TVar4._0_8_ = this;
    return TVar4;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

TPZDohrThreadMultData<TSubStruct> PopItem()
	{
		TPZDohrThreadMultData<TSubStruct> result;
    std::scoped_lock<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}